

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_f89de::ChangeInstructionTo
               (VmModule *module,VmInstruction *inst,VmInstructionType cmd,VmValue *first,
               VmValue *second,VmValue *third,VmValue *fourth,VmValue *fifth,uint *optCount)

{
  bool bVar1;
  VmValue **ppVVar2;
  uint i;
  uint index;
  SmallArray<VmValue_*,_128U> local_448;
  
  inst->cmd = cmd;
  local_448.allocator = module->allocator;
  local_448.data = local_448.little;
  local_448.count = 0;
  local_448.max = 0x80;
  SmallArray<VmValue_*,_128U>::reserve(&local_448,(inst->arguments).count);
  SmallArray<VmValue_*,_128U>::push_back(&local_448,(inst->arguments).data,(inst->arguments).count);
  (inst->arguments).count = 0;
  if (first == (VmValue *)0x0) {
    if (second != (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d2,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
LAB_0018f3ed:
    if (third != (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d8,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
LAB_0018f3f6:
    if (fourth != (VmValue *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3de,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
  }
  else {
    VmInstruction::AddArgument(inst,first);
    if (second == (VmValue *)0x0) goto LAB_0018f3ed;
    VmInstruction::AddArgument(inst,second);
    if (third == (VmValue *)0x0) goto LAB_0018f3f6;
    VmInstruction::AddArgument(inst,third);
    if (fourth != (VmValue *)0x0) {
      VmInstruction::AddArgument(inst,fourth);
      if (fifth != (VmValue *)0x0) {
        VmInstruction::AddArgument(inst,fifth);
      }
      goto LAB_0018f40a;
    }
  }
  if (fifth != (VmValue *)0x0) {
    __assert_fail("fourth",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3e4,
                  "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                 );
  }
LAB_0018f40a:
  for (index = 0; index < local_448.count; index = index + 1) {
    ppVVar2 = SmallArray<VmValue_*,_128U>::operator[](&local_448,index);
    VmValue::RemoveUse(*ppVVar2,&inst->super_VmValue);
  }
  bVar1 = HasSideEffects(cmd);
  (inst->super_VmValue).hasSideEffects = bVar1;
  bVar1 = HasMemoryAccess(cmd);
  (inst->super_VmValue).hasMemoryAccess = bVar1;
  if (optCount != (uint *)0x0) {
    *optCount = *optCount + 1;
  }
  SmallArray<VmValue_*,_128U>::~SmallArray(&local_448);
  return;
}

Assistant:

void ChangeInstructionTo(VmModule *module, VmInstruction *inst, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth, unsigned *optCount)
	{
		inst->cmd = cmd;

		SmallArray<VmValue*, 128> arguments(module->allocator);
		arguments.reserve(inst->arguments.size());
		arguments.push_back(inst->arguments.data, inst->arguments.size());

		inst->arguments.clear();

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			arguments[i]->RemoveUse(inst);

		inst->hasSideEffects = HasSideEffects(cmd);
		inst->hasMemoryAccess = HasMemoryAccess(cmd);

		if(optCount)
			(*optCount)++;
	}